

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

Future<void> * __thiscall
tf::Executor::run_until<DOCTEST_ANON_FUNC_8()::__1,DOCTEST_ANON_FUNC_8()::__2>
          (Executor *this,Taskflow *f,anon_class_4_1_69701ed9 *p,anon_class_1_0_00000001 *c)

{
  bool bVar1;
  size_type sVar2;
  anon_class_4_1_69701ed9 *in_RCX;
  anon_class_4_1_69701ed9 *in_RSI;
  Future<void> *in_RDI;
  anon_class_1_0_00000001 *in_R8;
  lock_guard<std::mutex> lock;
  shared_ptr<tf::Topology> t;
  promise<void> promise;
  Future<void> *future;
  promise<void> *in_stack_ffffffffffffff08;
  Executor *in_stack_ffffffffffffff10;
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  *this_00;
  future<void> *in_stack_ffffffffffffff18;
  future<void> *f_00;
  Future<void> *in_stack_ffffffffffffff20;
  Future<void> *this_01;
  Future<void> *__args_2;
  Taskflow *in_stack_ffffffffffffff48;
  promise<void> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  Worker *in_stack_ffffffffffffff78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff80;
  Future<void> local_78 [2];
  anon_class_1_0_00000001 *local_28;
  anon_class_4_1_69701ed9 *local_20;
  
  __args_2 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  _increment_topology(in_stack_ffffffffffffff10);
  bVar1 = Taskflow::empty((Taskflow *)0x11ab3b);
  if ((bVar1) || (bVar1 = DOCTEST_ANON_FUNC_8::anon_class_4_1_69701ed9::operator()(local_20), bVar1)
     ) {
    DOCTEST_ANON_FUNC_8::anon_class_1_0_00000001::operator()(local_28);
    std::promise<void>::promise((promise<void> *)in_RDI);
    std::promise<void>::set_value(in_stack_ffffffffffffff50);
    _decrement_topology(in_stack_ffffffffffffff10);
    std::promise<void>::get_future(in_stack_ffffffffffffff08);
    local_78[0].super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78[0].super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = local_78;
    std::weak_ptr<tf::Topology>::weak_ptr((weak_ptr<tf::Topology> *)0x11abc0);
    Future<void>::Future
              (this_01,in_stack_ffffffffffffff18,(weak_ptr<tf::Topology> *)in_stack_ffffffffffffff10
              );
    std::weak_ptr<tf::Topology>::~weak_ptr((weak_ptr<tf::Topology> *)0x11abe6);
    std::future<void>::~future((future<void> *)0x11abf3);
    std::promise<void>::~promise((promise<void> *)this_01);
  }
  else {
    f_00 = (future<void> *)&stack0xffffffffffffff78;
    std::
    make_shared<tf::Topology,tf::Taskflow&,DOCTEST_ANON_FUNC_8()::__1,DOCTEST_ANON_FUNC_8()::__2>
              (in_stack_ffffffffffffff48,in_RSI,(anon_class_1_0_00000001 *)__args_2);
    uVar3 = 0;
    std::__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11ac91);
    std::promise<void>::get_future(in_stack_ffffffffffffff08);
    this_00 = (queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
               *)&stack0xffffffffffffff50;
    std::weak_ptr<tf::Topology>::weak_ptr<tf::Topology,void>
              ((weak_ptr<tf::Topology> *)this_00,
               (shared_ptr<tf::Topology> *)in_stack_ffffffffffffff08);
    Future<void>::Future(in_stack_ffffffffffffff20,f_00,(weak_ptr<tf::Topology> *)this_00);
    std::weak_ptr<tf::Topology>::~weak_ptr((weak_ptr<tf::Topology> *)0x11acd8);
    std::future<void>::~future((future<void> *)0x11ace2);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffff08);
    std::
    queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
    ::push(this_00,(value_type *)in_stack_ffffffffffffff08);
    sVar2 = std::
            queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
            ::size((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                    *)0x11ad23);
    if (sVar2 == 1) {
      std::__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff78)
      ;
      _set_up_topology((Executor *)in_stack_ffffffffffffff80._M_pi,in_stack_ffffffffffffff78,
                       (Topology *)CONCAT17(uVar3,in_stack_ffffffffffffff70));
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11addc);
    std::shared_ptr<tf::Topology>::~shared_ptr((shared_ptr<tf::Topology> *)0x11adfc);
  }
  return __args_2;
}

Assistant:

tf::Future<void> Executor::run_until(Taskflow& f, P&& p, C&& c) {

  _increment_topology();

  //// Need to check the empty under the lock since subflow task may
  //// define detached blocks that modify the taskflow at the same time
  //bool empty;
  //{
  //  std::lock_guard<std::mutex> lock(f._mutex);
  //  empty = f.empty();
  //}

  // No need to create a real topology but returns an dummy future
  if(f.empty() || p()) {
    c();
    std::promise<void> promise;
    promise.set_value();
    _decrement_topology();
    return tf::Future<void>(promise.get_future());
  }

  // create a topology for this run
  auto t = std::make_shared<Topology>(f, std::forward<P>(p), std::forward<C>(c));

  // need to create future before the topology got torn down quickly
  tf::Future<void> future(t->_promise.get_future(), t);

  // modifying topology needs to be protected under the lock
  {
    std::lock_guard<std::mutex> lock(f._mutex);
    f._topologies.push(t);
    if(f._topologies.size() == 1) {
      _set_up_topology(pt::this_worker, t.get());
    }
  }

  return future;
}